

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UChar32 __thiscall icu_63::UnicodeSet::charAt(UnicodeSet *this,int32_t index)

{
  long lVar1;
  int iVar2;
  int32_t count;
  UChar32 start;
  int32_t i;
  int32_t len2;
  int32_t index_local;
  UnicodeSet *this_local;
  
  if (-1 < index) {
    count = 0;
    i = index;
    while (count < (int)(this->len & 0xfffffffeU)) {
      iVar2 = count + 1;
      lVar1 = (long)count;
      count = count + 2;
      iVar2 = this->list[iVar2] - this->list[lVar1];
      if (i < iVar2) {
        return this->list[lVar1] + i;
      }
      i = i - iVar2;
    }
  }
  return -1;
}

Assistant:

UChar32 UnicodeSet::charAt(int32_t index) const {
    if (index >= 0) {
        // len2 is the largest even integer <= len, that is, it is len
        // for even values and len-1 for odd values.  With odd values
        // the last entry is UNICODESET_HIGH.
        int32_t len2 = len & ~1;
        for (int32_t i=0; i < len2;) {
            UChar32 start = list[i++];
            int32_t count = list[i++] - start;
            if (index < count) {
                return (UChar32)(start + index);
            }
            index -= count;
        }
    }
    return (UChar32)-1;
}